

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

_Bool Curl_conn_is_ip_connected(Curl_easy *data,int sockindex)

{
  Curl_cfilter *pCVar1;
  Curl_cfilter **ppCVar2;
  
  ppCVar2 = data->conn->cfilter + sockindex;
  while( true ) {
    pCVar1 = *ppCVar2;
    if (pCVar1 == (Curl_cfilter *)0x0) {
      return false;
    }
    if ((pCVar1->field_0x24 & 1) != 0) break;
    ppCVar2 = &pCVar1->next;
    if ((pCVar1->cft->flags & 1) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Curl_conn_is_ip_connected(struct Curl_easy *data, int sockindex)
{
  struct Curl_cfilter *cf;

  cf = data->conn->cfilter[sockindex];
  while(cf) {
    if(cf->connected)
      return TRUE;
    if(cf->cft->flags & CF_TYPE_IP_CONNECT)
      return FALSE;
    cf = cf->next;
  }
  return FALSE;
}